

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

char * GetBytecodeFromPath(ParseContext *ctx,Lexeme *start,IntrusiveList<SynIdentifier> parts)

{
  SmallArray<InplaceStr,_8U> *this;
  CompilerStatistics *this_00;
  InplaceStr *pIVar1;
  uint uVar2;
  long lVar3;
  Allocator *pAVar4;
  ErrorInfo **ppEVar5;
  ArrayView<InplaceStr> AVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  size_t sVar11;
  undefined4 extraout_var;
  SynIdentifier *pSVar13;
  ulong uVar14;
  long lVar15;
  char *pcVar16;
  IntrusiveList<SynIdentifier> parts_00;
  IntrusiveList<SynIdentifier> parts_01;
  char *pos;
  TraceScope traceScope;
  GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> allocator;
  ChunkedStackPool<65532> pool;
  InplaceStr local_c8;
  Lexeme *local_b8;
  SynIdentifier *local_b0;
  char *local_a8;
  InplaceStr *local_a0;
  uint uStack_98;
  undefined4 uStack_94;
  TraceScope local_90;
  GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> local_80;
  ChunkedStackPool<65532> local_48;
  ErrorInfo *pEVar12;
  
  pSVar13 = parts.tail;
  parts_00.head = parts.head;
  local_b8 = start;
  uVar8 = NULLCTime::clockMicro();
  (ctx->statistics).startTime = uVar8;
  (ctx->statistics).finishTime = 0;
  parts_00.tail = pSVar13;
  local_c8 = GetModuleName(ctx->allocator,ctx->moduleRoot,parts_00);
  if (GetBytecodeFromPath(ParseContext&,Lexeme*,IntrusiveList<SynIdentifier>)::token == '\0') {
    iVar9 = __cxa_guard_acquire(&GetBytecodeFromPath(ParseContext&,Lexeme*,IntrusiveList<SynIdentifier>)
                                 ::token);
    if (iVar9 != 0) {
      GetBytecodeFromPath::token = NULLC::TraceGetToken("parser","GetBytecodeFromPath");
      __cxa_guard_release(&GetBytecodeFromPath(ParseContext&,Lexeme*,IntrusiveList<SynIdentifier>)::
                           token);
    }
  }
  NULLC::TraceScope::TraceScope(&local_90,GetBytecodeFromPath::token);
  lVar15 = NULLC::traceContext;
  pcVar10 = local_c8.begin;
  uVar14 = (long)local_c8.end - (long)local_c8.begin;
  iVar9 = (int)uVar14;
  if (iVar9 != 0) {
    uVar8 = iVar9 + 1;
    if ((*(uint *)(NULLC::traceContext + 0x264) <= *(int *)(NULLC::traceContext + 0x260) + uVar8) ||
       (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
      NULLC::TraceDump();
    }
    local_b0 = parts_00.head;
    if (*(uint *)(lVar15 + 0x264) <= uVar8) {
      __assert_fail("count + 1 < context.labels.max",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                    ,0x142,"void NULLC::TraceLabel(const char *, const char *)");
    }
    uVar2 = *(uint *)(lVar15 + 0x260);
    memcpy((void *)((ulong)uVar2 + *(long *)(lVar15 + 0x268)),pcVar10,uVar14 & 0xffffffff);
    *(undefined1 *)(*(long *)(lVar15 + 0x268) + (ulong)(uint)(*(int *)(lVar15 + 0x260) + iVar9)) = 0
    ;
    *(int *)(lVar15 + 0x260) = *(int *)(lVar15 + 0x260) + uVar8;
    lVar3 = *(long *)(lVar15 + 0x278);
    pSVar13 = (SynIdentifier *)(ulong)*(uint *)(lVar15 + 0x270);
    *(uint *)(lVar15 + 0x270) = *(uint *)(lVar15 + 0x270) + 1;
    *(uint *)(lVar3 + (long)pSVar13 * 8) = uVar2 * 4 + 2;
    *(undefined4 *)(lVar3 + 4 + (long)pSVar13 * 8) = 0;
    parts_00.head = local_b0;
  }
  pcVar10 = BinaryCache::FindBytecode(local_c8.begin,false);
  if (pcVar10 == (char *)0x0) {
    parts_01.tail = pSVar13;
    parts_01.head = parts_00.head;
    local_c8 = GetModuleName(ctx->allocator,(char *)0x0,parts_01);
    pcVar10 = BinaryCache::FindBytecode(local_c8.begin,false);
  }
  this = &ctx->activeImports;
  uVar8 = (ctx->activeImports).count;
  if (uVar8 != 0) {
    lVar15 = 0;
    uVar14 = 0;
    do {
      bVar7 = InplaceStr::operator==((InplaceStr *)((long)&this->data->begin + lVar15),&local_c8);
      if (bVar7) {
        anon_unknown.dwarf_15703::Stop
                  (ctx,local_b8,"ERROR: found cyclic dependency on module \'%.*s\'",
                   (ulong)(uint)((int)local_c8.end - (int)local_c8.begin));
      }
      uVar14 = uVar14 + 1;
      uVar8 = (ctx->activeImports).count;
      lVar15 = lVar15 + 0x10;
    } while (uVar14 < uVar8);
  }
  if (uVar8 == (ctx->activeImports).max) {
    SmallArray<InplaceStr,_8U>::grow(this,uVar8);
  }
  if (this->data != (InplaceStr *)0x0) {
    this_00 = &ctx->statistics;
    uVar8 = (ctx->activeImports).count;
    (ctx->activeImports).count = uVar8 + 1;
    pIVar1 = this->data + uVar8;
    *(undefined4 *)&pIVar1->begin = local_c8.begin._0_4_;
    *(undefined4 *)((long)&pIVar1->begin + 4) = local_c8.begin._4_4_;
    *(int *)&pIVar1->end = (int)local_c8.end;
    *(undefined4 *)((long)&pIVar1->end + 4) = local_c8.end._4_4_;
    if (pcVar10 == (char *)0x0) {
      if (ctx->bytecodeBuilder ==
          (_func_char_ptr_Allocator_ptr_InplaceStr_char_ptr_bool_char_ptr_ptr_char_ptr_uint_int_ArrayView<InplaceStr>_CompilerStatistics_ptr
           *)0x0) {
        anon_unknown.dwarf_15703::Stop(ctx,local_b8,"ERROR: import builder is not provided");
      }
      if (ctx->errorCount == 0) {
        ctx->errorPos = local_b8->pos;
        ctx->errorBufLocation = ctx->errorBuf;
      }
      parts_00.head = (SynIdentifier *)ctx->errorBufLocation;
      local_80.pool = &local_48;
      local_48.first = (StackChunk *)0x0;
      local_48.curr = (StackChunk *)0x0;
      local_48.size = 0xfffc;
      local_80.super_Allocator._vptr_Allocator = (_func_int **)&PTR__GrowingAllocatorRef_00247030;
      local_80.total = 0;
      local_80.allocLimit = 0xffffffff;
      local_80.allocLimitContext = (void *)0x0;
      local_80.allocLimitCallback = (_func_void_void_ptr *)0x0;
      local_80.largeObjects.data = (void **)0x0;
      local_80.largeObjects.max = 0;
      local_80.largeObjects.count = 0;
      uVar8 = NULLCTime::clockMicro();
      CompilerStatistics::Finish(this_00,"Extra",uVar8);
      local_a8 = (char *)0x0;
      local_a0 = (ctx->activeImports).data;
      uStack_98 = (ctx->activeImports).count;
      AVar6._12_4_ = uStack_94;
      AVar6.count = uStack_98;
      AVar6.data = local_a0;
      pcVar10 = (*ctx->bytecodeBuilder)
                          (&local_80.super_Allocator,local_c8,ctx->moduleRoot,false,&local_a8,
                           ctx->errorBufLocation,
                           (*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation) + ctx->errorBufSize
                           ,ctx->optimizationLevel,AVar6,this_00);
      uVar8 = NULLCTime::clockMicro();
      (ctx->statistics).startTime = uVar8;
      (ctx->statistics).finishTime = 0;
      if (pcVar10 == (char *)0x0) {
        if ((ctx->errorBuf != (char *)0x0) && (ctx->errorBufSize != 0)) {
          pcVar16 = ctx->errorBufLocation;
          local_b0 = parts_00.head;
          sVar11 = strlen(pcVar16);
          pcVar16 = pcVar16 + sVar11;
          ctx->errorBufLocation = pcVar16;
          iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
          pEVar12 = (ErrorInfo *)CONCAT44(extraout_var,iVar9);
          pAVar4 = ctx->allocator;
          pEVar12->messageStart = (char *)local_b0;
          pEVar12->messageEnd = pcVar16;
          pEVar12->begin = local_b8;
          pEVar12->end = local_b8;
          pEVar12->pos = local_a8;
          (pEVar12->related).allocator = pAVar4;
          (pEVar12->related).data = (pEVar12->related).little;
          (pEVar12->related).count = 0;
          (pEVar12->related).max = 4;
          pEVar12->parentModule = (ModuleData *)0x0;
          uVar8 = (ctx->errorInfo).count;
          if (uVar8 == (ctx->errorInfo).max) {
            SmallArray<ErrorInfo_*,_4U>::grow(&ctx->errorInfo,uVar8);
          }
          ppEVar5 = (ctx->errorInfo).data;
          if (ppEVar5 == (ErrorInfo **)0x0) {
            pcVar10 = 
            "void SmallArray<ErrorInfo *, 4>::push_back(const T &) [T = ErrorInfo *, N = 4]";
            goto LAB_0011afdb;
          }
          uVar8 = (ctx->errorInfo).count;
          (ctx->errorInfo).count = uVar8 + 1;
          ppEVar5[uVar8] = pEVar12;
          AddErrorLocationInfo
                    (ctx->code,local_a8,ctx->errorBufLocation,
                     (*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation) + ctx->errorBufSize);
          pcVar16 = ctx->errorBufLocation;
          sVar11 = strlen(pcVar16);
          ctx->errorBufLocation = pcVar16 + sVar11;
        }
        ctx->errorCount = ctx->errorCount + 1;
      }
      GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::~GrowingAllocatorRef(&local_80);
      ChunkedStackPool<65532>::~ChunkedStackPool(&local_48);
    }
    uVar8 = NULLCTime::clockMicro();
    CompilerStatistics::Finish(this_00,"Extra",uVar8);
    NULLC::TraceScope::~TraceScope(&local_90);
    return pcVar10;
  }
  pcVar10 = "void SmallArray<InplaceStr, 8>::push_back(const T &) [T = InplaceStr, N = 8]";
LAB_0011afdb:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,pcVar10);
}

Assistant:

const char* GetBytecodeFromPath(ParseContext &ctx, Lexeme *start, IntrusiveList<SynIdentifier> parts)
{
	ctx.statistics.Start(NULLCTime::clockMicro());

	InplaceStr moduleName = GetModuleName(ctx.allocator, ctx.moduleRoot, parts);

	TRACE_SCOPE("parser", "GetBytecodeFromPath");
	TRACE_LABEL2(moduleName.begin, moduleName.end);

	const char *bytecode = BinaryCache::FindBytecode(moduleName.begin, false);

	if(!bytecode)
	{
		moduleName = GetModuleName(ctx.allocator, NULL, parts);

		bytecode = BinaryCache::FindBytecode(moduleName.begin, false);
	}

	for(unsigned i = 0; i < ctx.activeImports.size(); i++)
	{
		if(ctx.activeImports[i] == moduleName)
			Stop(ctx, start, "ERROR: found cyclic dependency on module '%.*s'", moduleName.length(), moduleName.begin);
	}

	ctx.activeImports.push_back(moduleName);

	if(!bytecode)
	{
		if(!ctx.bytecodeBuilder)
			Stop(ctx, start, "ERROR: import builder is not provided");

		if(ctx.errorCount == 0)
		{
			ctx.errorPos = start->pos;
			ctx.errorBufLocation = ctx.errorBuf;
		}

		const char *messageStart = ctx.errorBufLocation;

		// Separate allocator for each module
		ChunkedStackPool<65532> pool;
		GrowingAllocatorRef<ChunkedStackPool<65532>, 16384> allocator(pool);

		ctx.statistics.Finish("Extra", NULLCTime::clockMicro());

		const char *pos = NULL;
		bytecode = ctx.bytecodeBuilder(&allocator, moduleName, ctx.moduleRoot, false, &pos, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), ctx.optimizationLevel, ctx.activeImports, &ctx.statistics);

		ctx.statistics.Start(NULLCTime::clockMicro());

		if(!bytecode)
		{
			if(ctx.errorBuf && ctx.errorBufSize)
			{
				ctx.errorBufLocation += strlen(ctx.errorBufLocation);

				const char *messageEnd = ctx.errorBufLocation;

				ctx.errorInfo.push_back(new (ctx.get<ErrorInfo>()) ErrorInfo(ctx.allocator, messageStart, messageEnd, start, start, pos));

				AddErrorLocationInfo(ctx.code, pos, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf));

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);
			}

			ctx.errorCount++;
		}
	}

	ctx.statistics.Finish("Extra", NULLCTime::clockMicro());

	return bytecode;
}